

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O3

void __thiscall GraphContigger::extend_to_repeats(GraphContigger *this,int max_size)

{
  sgNodeID_t sVar1;
  pointer pLVar2;
  uint64_t uVar3;
  pointer pLVar4;
  pointer this_00;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> through;
  NodeView nv;
  sgNodeID_t fwn;
  GraphEditor ge;
  vector<LinkView,_std::allocator<LinkView>_> local_218;
  vector<LinkView,_std::allocator<LinkView>_> local_200;
  vector<LinkView,_std::allocator<LinkView>_> local_1e8;
  vector<NodeView,_std::allocator<NodeView>_> local_1d0;
  NodeView local_1b8;
  NodeView *local_1a8;
  NodeView *local_1a0;
  ulong local_198;
  sgNodeID_t local_190;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_188;
  vector<NodeView,_std::allocator<NodeView>_> local_170;
  sgNodeID_t local_158;
  DistanceGraph *pDStack_150;
  NodeView local_148;
  NodeView local_138;
  NodeView local_128;
  GraphEditor local_118;
  
  GraphEditor::GraphEditor(&local_118,*(WorkSpace **)this);
  DistanceGraph::get_all_nodeviews(&local_1d0,*(DistanceGraph **)this,false,true);
  local_1a8 = local_1d0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_1d0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1d0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = (ulong)max_size;
    this_00 = local_1d0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_198 = uVar6;
    do {
      local_158 = this_00->id;
      pDStack_150 = this_00->dg;
      local_1a0 = this_00;
      local_148 = NodeView::rc(this_00);
      lVar5 = 0;
      do {
        local_1b8.id = *(sgNodeID_t *)((long)&local_158 + lVar5);
        local_1b8.dg = *(DistanceGraph **)((long)&pDStack_150 + lVar5);
        uVar3 = NodeView::size(&local_1b8);
        if (uVar3 <= uVar6) {
          NodeView::prev(&local_218,&local_1b8);
          bVar7 = true;
          if (1 < (ulong)(((long)local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x3333333333333333)) {
            NodeView::next(&local_200,&local_1b8);
            bVar7 = (long)local_200.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_200.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_start != 0x28;
            if (local_200.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_200.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_200.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_200.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
          }
          if (local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar7) {
            NodeView::next(&local_218,&local_1b8);
            sVar1 = ((local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                      super__Vector_impl_data._M_start)->node_view).id;
            operator_delete(local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_190 = sVar1;
            NodeView::prev(&local_200,&local_1b8);
            pLVar2 = local_200.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pLVar4 = local_200.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (local_200.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_200.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              bVar7 = true;
            }
            else {
              do {
                local_128.id = (pLVar4->node_view).id;
                local_128.dg = (pLVar4->node_view).dg;
                NodeView::next(&local_1e8,&local_128);
                if ((ulong)(((long)local_1e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x3333333333333333) < 2) {
                  local_138.id = (pLVar4->node_view).id;
                  local_138.dg = (pLVar4->node_view).dg;
                  NodeView::parallels(&local_170,&local_138);
                  bVar7 = 0x10 < (ulong)((long)local_170.
                                               super__Vector_base<NodeView,_std::allocator<NodeView>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_170.
                                              super__Vector_base<NodeView,_std::allocator<NodeView>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                  if (local_170.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_170.
                                    super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_170.
                                          super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_170.
                                          super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                }
                else {
                  bVar7 = true;
                }
                if (local_1e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_1e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_1e8.
                                        super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_1e8.
                                        super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                if (bVar7) break;
                local_1e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)-(pLVar4->node_view).id;
                std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
                emplace_back<long,long&>
                          ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
                           &local_218,(long *)&local_1e8,&local_190);
                pLVar4 = pLVar4 + 1;
              } while (pLVar4 != pLVar2);
              bVar7 = (bool)(bVar7 ^ 1);
            }
            if (local_200.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_200.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_200.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_200.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            uVar6 = local_198;
            sVar1 = local_1b8.id;
            if (bVar7) {
              std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
                        (&local_188,
                         (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                         &local_218);
              GraphEditor::queue_node_expansion(&local_118,sVar1,&local_188);
              if (local_188.
                  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.
                                super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.
                                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.
                                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            if (local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_218.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_218.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_218.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
          }
        }
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x20);
      this_00 = local_1a0 + 1;
    } while (this_00 != local_1a8);
  }
  if (local_1d0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start != (NodeView *)0x0) {
    operator_delete(local_1d0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  GraphEditor::apply_all(&local_118);
  GraphEditor::~GraphEditor(&local_118);
  return;
}

Assistant:

void GraphContigger::extend_to_repeats(int max_size) {
    GraphEditor ge(ws);
    for (auto &fnv:ws.sdg.get_all_nodeviews()){
        for (auto nv:{fnv,fnv.rc()} ){
            if (nv.size()>max_size) continue;
            if (nv.prev().size()<2 or nv.next().size()!=1) continue;
            auto fwn=nv.next()[0].node().node_id();
            bool b=false;
            std::vector<std::pair<sgNodeID_t ,sgNodeID_t >> through;
            for (auto &lp:nv.prev()){
                if (lp.node().next().size()>1 or lp.node().parallels().size()>1){
                    b=true;
                    break;
                }
                through.emplace_back(-lp.node().node_id(),fwn);
            }
            if (b) continue;

            ge.queue_node_expansion(nv.node_id(),through);
        }
    }
    ge.apply_all();
//    def collapse_into_inputs(g,e, max_collapsed_size=500):
//    """Finds all nodes representing only shared sequence at the end of previous nodes, collapses back, only queues operations"""
//    for nvf in g.get_all_nodeviews():
//        for nv in [nvf,nvf.rc()]:
//            if nv.size()>max_collapsed_size: continue #don't expand large nodes
//            if len(nv.prev())<=1 or len(nv.next())!=1: continue
//            b=False
//            for lp in nv.prev():
//                if len(lp.node().next())>1 or len(lp.node().parallels())>1: #a single conflicted prev node skips the expansion, could be solved partially?
//                    b=True
//                    break#don't expand after a bubble
//            if b: continue
//            #TODO: tip check? is it even needed now?
//            #print([[-x.node().node_id(), nv.next()[0].node().node_id()] for x in nv.prev()])
//            e.queue_node_expansion(nv.node_id(),[[-x.node().node_id(), nv.next()[0].node().node_id()] for x in nv.prev()])
}